

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

route_id __thiscall
helics::CoreBroker::fillMessageRouteInformation(CoreBroker *this,ActionMessage *mess)

{
  bool bVar1;
  BasicHandleInfo *pBVar2;
  pointer ppVar3;
  ActionMessage *in_RSI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  *in_RDI;
  __sv_type name;
  iterator fnd2;
  BasicHandleInfo *eptInfo;
  string *endpointName;
  undefined8 in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
  in_stack_ffffffffffffffa8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
  local_50;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  InterfaceType type;
  HandleManager *in_stack_ffffffffffffffc0;
  GlobalHandle hand;
  BaseType local_4;
  
  type = (InterfaceType)((uint)in_stack_ffffffffffffffbc >> 0x18);
  ActionMessage::getString_abi_cxx11_
            ((ActionMessage *)in_stack_ffffffffffffffa8._M_cur,
             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  name = std::__cxx11::string::operator_cast_to_basic_string_view
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &in_RDI[0x13]._M_h._M_before_begin);
  pBVar2 = HandleManager::getInterfaceHandle(in_stack_ffffffffffffffc0,name,type);
  if (pBVar2 == (BasicHandleInfo *)0x0) {
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
         ::find(in_RDI,(key_type *)0x5f1563);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
    ::end(in_RDI);
    bVar1 = std::__detail::operator==
                      (&local_50,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
                        *)&stack0xffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_4 = 0;
    }
    else {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_false,_true>
                             *)0x5f159e);
      local_4 = (ppVar3->second).rid;
    }
  }
  else {
    hand = pBVar2->handle;
    ActionMessage::setDestination(in_RSI,hand);
    local_4 = (BaseType)
              getRoute((CoreBroker *)CONCAT44((pBVar2->handle).fed_id.gid,in_stack_ffffffffffffffb8)
                       ,hand.fed_id.gid);
  }
  return (route_id)local_4;
}

Assistant:

route_id CoreBroker::fillMessageRouteInformation(ActionMessage& mess)
{
    const auto& endpointName = mess.getString(targetStringLoc);
    auto* eptInfo = handles.getInterfaceHandle(endpointName, InterfaceType::ENDPOINT);
    if (eptInfo != nullptr) {
        mess.setDestination(eptInfo->handle);
        return getRoute(eptInfo->handle.fed_id);
    }
    auto fnd2 = knownExternalEndpoints.find(endpointName);
    if (fnd2 != knownExternalEndpoints.end()) {
        return fnd2->second;
    }
    return parent_route_id;
}